

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::PrefixOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  data_t dVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  char acStack_34 [4];
  char *local_30;
  undefined8 local_28;
  long local_20;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) ||
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) {
    ConstantVector::SetNull(result,true);
    return;
  }
  local_28 = *(undefined8 *)left->data;
  local_20 = *(long *)(left->data + 8);
  uVar2 = *(ulong *)right->data;
  local_30 = *(char **)((long)right->data + 8);
  uVar5 = (uint)uVar2;
  uVar6 = (uint)local_28;
  if (uVar6 < uVar5) {
LAB_0110cf6f:
    dVar3 = '\0';
  }
  else {
    uVar2 = uVar2 & 0xffffffff;
    if (uVar5 < 5) {
      dVar3 = '\x01';
      if (uVar5 != 0) {
        uVar4 = 0;
        do {
          if (*(char *)((long)&local_28 + uVar4 + 4) != acStack_34[uVar4]) goto LAB_0110cf6f;
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
    }
    else {
      lVar7 = 0;
      do {
        if (*(char *)((long)&local_28 + lVar7 + 4) != acStack_34[lVar7]) goto LAB_0110cf6f;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      if (uVar6 < 0xd) {
        local_20 = (long)&local_28 + 4;
      }
      if (uVar5 < 0xd) {
        local_30 = acStack_34;
      }
      uVar4 = 4;
      do {
        if (*(char *)(local_20 + uVar4) != local_30[uVar4]) goto LAB_0110cf6f;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      dVar3 = '\x01';
    }
  }
  *result->data = dVar3;
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}